

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O3

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,Mat *left_rect,Mat *right_rect)

{
  int *piVar1;
  undefined2 uVar2;
  int iVar3;
  uchar *puVar4;
  int j;
  long lVar5;
  int i;
  long lVar6;
  
  iVar3 = capture_frame(this);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error : failed to capture Infrared frame.",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    return;
  }
  lVar6 = 0;
  cv::Mat::create((int)left_rect,0x1e0,0x280);
  cv::Mat::create((int)right_rect,0x1e0,0x280);
  puVar4 = this->m_pBigBuffer;
  do {
    lVar5 = 0;
    do {
      uVar2 = *(undefined2 *)(puVar4 + lVar5 * 2);
      *(char *)(lVar5 + **(long **)(left_rect + 0x48) * lVar6 + *(long *)(left_rect + 0x10)) =
           (char)uVar2;
      *(char *)(lVar5 + **(long **)(right_rect + 0x48) * lVar6 + *(long *)(right_rect + 0x10)) =
           (char)((ushort)uVar2 >> 8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x280);
    lVar6 = lVar6 + 1;
    puVar4 = puVar4 + 0x500;
  } while (lVar6 != 0x1e0);
  piVar1 = &(this->super_CameraBase).m_frameCount;
  *piVar1 = *piVar1 + 1;
  CameraBase::saveFrame(&this->super_CameraBase,left_rect,right_rect);
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (cv::Mat &left_rect, cv::Mat &right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    left_rect.create  (480, 640, CV_8UC1);
    right_rect.create (480, 640, CV_8UC1);
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect.at<unsigned char> (i, j)  = lr_pixel % 256;
            right_rect.at<unsigned char> (i, j) = lr_pixel / 256;
        }
    }
    incrementFrameCount ();
    saveFrame (left_rect, right_rect);
}